

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGLDriver::enableClipPlane(COpenGLDriver *this,u32 index,bool enable)

{
  if (index < (byte)(this->super_CNullDriver).field_0x49c) {
    if (enable) {
      if ((this->UserClipPlanes).m_data.
          super__Vector_base<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
          ._M_impl.super__Vector_impl_data._M_start[index].Enabled == false) {
        uploadClipPlane(this,index);
        glEnable(index + 0x3000);
      }
    }
    else {
      glDisable(index + 0x3000);
    }
    (this->UserClipPlanes).m_data.
    super__Vector_base<irr::video::COpenGLDriver::SUserClipPlane,_std::allocator<irr::video::COpenGLDriver::SUserClipPlane>_>
    ._M_impl.super__Vector_impl_data._M_start[index].Enabled = enable;
  }
  return;
}

Assistant:

void COpenGLDriver::enableClipPlane(u32 index, bool enable)
{
	if (index >= MaxUserClipPlanes)
		return;
	if (enable) {
		if (!UserClipPlanes[index].Enabled) {
			uploadClipPlane(index);
			glEnable(GL_CLIP_PLANE0 + index);
		}
	} else
		glDisable(GL_CLIP_PLANE0 + index);

	UserClipPlanes[index].Enabled = enable;
}